

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_uncompressed_block(stbi__zbuf *a)

{
  stbi_uc sVar1;
  uint n;
  int iVar2;
  int local_28;
  int k;
  int nlen;
  int len;
  stbi_uc header [4];
  stbi__zbuf *a_local;
  
  _len = a;
  if ((a->num_bits & 7U) != 0) {
    stbi__zreceive(a,a->num_bits & 7);
  }
  local_28 = 0;
  while (0 < _len->num_bits) {
    *(char *)((long)&nlen + (long)local_28) = (char)_len->code_buffer;
    _len->code_buffer = _len->code_buffer >> 8;
    _len->num_bits = _len->num_bits + -8;
    local_28 = local_28 + 1;
  }
  if (_len->num_bits < 0) {
    a_local._4_4_ = stbi__err("zlib corrupt");
  }
  else {
    while (local_28 < 4) {
      sVar1 = stbi__zget8(_len);
      *(stbi_uc *)((long)&nlen + (long)local_28) = sVar1;
      local_28 = local_28 + 1;
    }
    n = (uint)nlen._1_1_ * 0x100 + (uint)(byte)nlen;
    if ((uint)nlen._3_1_ * 0x100 + (uint)nlen._2_1_ == (n ^ 0xffff)) {
      if (_len->zbuffer_end < _len->zbuffer + (int)n) {
        a_local._4_4_ = stbi__err("read past buffer");
      }
      else if ((_len->zout_end < _len->zout + (int)n) &&
              (iVar2 = stbi__zexpand(_len,_len->zout,n), iVar2 == 0)) {
        a_local._4_4_ = 0;
      }
      else {
        memcpy(_len->zout,_len->zbuffer,(long)(int)n);
        _len->zbuffer = _len->zbuffer + (int)n;
        _len->zout = _len->zout + (int)n;
        a_local._4_4_ = 1;
      }
    }
    else {
      a_local._4_4_ = stbi__err("zlib corrupt");
    }
  }
  return a_local._4_4_;
}

Assistant:

static int stbi__parse_uncompressed_block(stbi__zbuf *a)
{
   stbi_uc header[4];
   int len,nlen,k;
   if (a->num_bits & 7)
      stbi__zreceive(a, a->num_bits & 7); // discard
   // drain the bit-packed data into header
   k = 0;
   while (a->num_bits > 0) {
      header[k++] = (stbi_uc) (a->code_buffer & 255); // suppress MSVC run-time check
      a->code_buffer >>= 8;
      a->num_bits -= 8;
   }
   if (a->num_bits < 0) return stbi__err("zlib corrupt","Corrupt PNG");
   // now fill header the normal way
   while (k < 4)
      header[k++] = stbi__zget8(a);
   len  = header[1] * 256 + header[0];
   nlen = header[3] * 256 + header[2];
   if (nlen != (len ^ 0xffff)) return stbi__err("zlib corrupt","Corrupt PNG");
   if (a->zbuffer + len > a->zbuffer_end) return stbi__err("read past buffer","Corrupt PNG");
   if (a->zout + len > a->zout_end)
      if (!stbi__zexpand(a, a->zout, len)) return 0;
   memcpy(a->zout, a->zbuffer, len);
   a->zbuffer += len;
   a->zout += len;
   return 1;
}